

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int latin1ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  int local_5c;
  uint c;
  int ret;
  uchar *inend;
  uchar *outend;
  uchar *instart;
  uchar *outstart;
  void *vctxt_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  local_5c = -3;
  if ((((out == (uchar *)0x0) || (in == (uchar *)0x0)) || (outlen == (int *)0x0)) ||
     (inlen == (int *)0x0)) {
    out_local._4_4_ = -1;
  }
  else {
    iVar2 = *outlen;
    iVar3 = *inlen;
    inlen_local = (int *)in;
    outlen_local = (int *)out;
    while( true ) {
      if (in + iVar3 <= inlen_local) break;
      bVar1 = (byte)*inlen_local;
      if (bVar1 < 0x80) {
        if (out + iVar2 <= outlen_local) goto LAB_00130651;
        *(byte *)outlen_local = bVar1;
        outlen_local = (int *)((long)outlen_local + 1);
      }
      else {
        if ((long)(out + iVar2) - (long)outlen_local < 2) goto LAB_00130651;
        pbVar4 = (byte *)((long)outlen_local + 1);
        *(byte *)outlen_local = bVar1 >> 6 | 0xc0;
        outlen_local = (int *)((long)outlen_local + 2);
        *pbVar4 = bVar1 & 0x3f | 0x80;
      }
      inlen_local = (int *)((long)inlen_local + 1);
    }
    local_5c = (int)outlen_local - (int)out;
LAB_00130651:
    *outlen = (int)outlen_local - (int)out;
    *inlen = (int)inlen_local - (int)in;
    out_local._4_4_ = local_5c;
  }
  return out_local._4_4_;
}

Assistant:

static int
latin1ToUTF8(unsigned char* out, int *outlen,
             const unsigned char* in, int *inlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    unsigned char* outstart = out;
    const unsigned char* instart = in;
    unsigned char* outend;
    const unsigned char* inend;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (in == NULL) || (outlen == NULL) || (inlen == NULL))
	return(XML_ENC_ERR_INTERNAL);

    outend = out + *outlen;
    inend = in + *inlen;

    while (in < inend) {
        unsigned c = *in;

	if (c < 0x80) {
            if (out >= outend)
                goto done;
            *out++ = c;
	} else {
            if (outend - out < 2)
                goto done;
	    *out++ = (c >> 6) | 0xC0;
            *out++ = (c & 0x3F) | 0x80;
        }

        in++;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}